

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcObject::~IfcObject(IfcObject *this)

{
  undefined1 *puVar1;
  
  *(undefined ***)&this[-1].field_0x50 = &PTR__IfcObject_008f59a0;
  *(undefined ***)&this->field_0x38 = &PTR__IfcObject_008f5a18;
  *(undefined ***)&this[-1].field_0xd8 = &PTR__IfcObject_008f59c8;
  *(undefined ***)this = &PTR__IfcObject_008f59f0;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10);
  }
  *(undefined8 *)&this[-1].field_0x50 = 0x8f5b30;
  *(undefined8 *)&this->field_0x38 = 0x8f5b58;
  puVar1 = *(undefined1 **)
            &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x18;
  if (puVar1 != &this[-1].field_0xc0) {
    operator_delete(puVar1);
  }
  if ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL> *)*(undefined1 **)&this[-1].field_0x88
      != &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>) {
    operator_delete(*(undefined1 **)&this[-1].field_0x88);
  }
  if (*(undefined1 **)&this[-1].field_0x60 != &this[-1].field_0x70) {
    operator_delete(*(undefined1 **)&this[-1].field_0x60);
  }
  operator_delete(&this[-1].field_0x50);
  return;
}

Assistant:

IfcObject() : Object("IfcObject") {}